

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginBlock
          (WatWriter *this,LabelType label_type,Block *block,char *text)

{
  WritePuts(this,text,Space);
  if ((block->label)._M_string_length == 0) {
    WriteTypes(this,&(block->decl).sig.param_types,"param");
    WriteTypes(this,&(block->decl).sig.result_types,"result");
    Writef(this," ;; label = @%u",
           (ulong)(uint)((int)((ulong)((long)(this->super_ModuleContext).label_stack_.
                                             super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->super_ModuleContext).label_stack_.
                                            super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d));
  }
  else {
    WritePuts(this,(block->label)._M_dataplus._M_p,Space);
    WriteTypes(this,&(block->decl).sig.param_types,"param");
    WriteTypes(this,&(block->decl).sig.result_types,"result");
  }
  if (this->next_char_ == ForceNewline) {
    WriteNextChar(this);
  }
  this->next_char_ = ForceNewline;
  ModuleContext::BeginBlock(&this->super_ModuleContext,label_type,block);
  this->indent_ = this->indent_ + 2;
  return;
}

Assistant:

void WatWriter::WriteBeginBlock(LabelType label_type,
                                const Block& block,
                                const char* text) {
  WritePutsSpace(text);
  bool has_label = !block.label.empty();
  if (has_label) {
    WriteString(block.label, NextChar::Space);
  }
  WriteTypes(block.decl.sig.param_types, "param");
  WriteTypes(block.decl.sig.result_types, "result");
  if (!has_label) {
    Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
  }
  WriteNewline(FORCE_NEWLINE);
  BeginBlock(label_type, block);
  Indent();
}